

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mathtypes.h
# Opt level: O2

bool __thiscall rengine::rect2d::contains(rect2d *this,vec2 p)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  bool bVar5;
  
  fVar1 = (this->tl).x;
  fVar2 = (this->br).x;
  if (fVar2 <= fVar1) {
    __assert_fail("tl.x < br.x",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/common/mathtypes.h"
                  ,600,"bool rengine::rect2d::contains(vec2) const");
  }
  fVar3 = (this->tl).y;
  fVar4 = (this->br).y;
  if (fVar3 < fVar4) {
    bVar5 = false;
    if ((fVar1 <= p.x) && (bVar5 = false, p.x <= fVar2)) {
      if (fVar3 <= p.y) {
        bVar5 = p.y <= fVar4;
      }
      else {
        bVar5 = false;
      }
    }
    return bVar5;
  }
  __assert_fail("tl.y < br.y",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/common/mathtypes.h"
                ,0x259,"bool rengine::rect2d::contains(vec2) const");
}

Assistant:

bool contains(vec2 p) const {
        assert(tl.x < br.x);
        assert(tl.y < br.y);
        return p.x >= tl.x && p.x <= br.x
            && p.y >= tl.y && p.y <= br.y;
    }